

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_rollback(jit_State *J,IRRef ref)

{
  IRIns *pIVar1;
  IRIns *ir;
  IRRef nins;
  IRRef ref_local;
  jit_State *J_local;
  
  nins = (J->cur).nins;
  while (ref < nins) {
    nins = nins - 1;
    pIVar1 = (J->cur).ir;
    J->chain[(&pIVar1->field_1)[nins].o] = (&pIVar1->field_0)[nins].prev;
  }
  (J->cur).nins = nins;
  return;
}

Assistant:

void lj_ir_rollback(jit_State *J, IRRef ref)
{
  IRRef nins = J->cur.nins;
  while (nins > ref) {
    IRIns *ir;
    nins--;
    ir = IR(nins);
    J->chain[ir->o] = ir->prev;
  }
  J->cur.nins = nins;
}